

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall Json::StyledStreamWriter::isMultineArray(StyledStreamWriter *this,Value *value)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  ArrayIndex AVar5;
  Value *pVVar6;
  long lVar7;
  StyledStreamWriter *this_00;
  byte bVar8;
  int iVar9;
  ulong uVar10;
  
  AVar4 = Value::size(value);
  bVar1 = this->rightMargin_ <= (int)(AVar4 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  if (0 < (int)AVar4 && !bVar1) {
    iVar9 = 1;
    do {
      pVVar6 = Value::operator[](value,iVar9 + -1);
      bVar1 = Value::isArray(pVVar6);
      if (bVar1) {
LAB_00147ccd:
        AVar5 = Value::size(pVVar6);
        bVar1 = AVar5 != 0;
      }
      else {
        bVar1 = Value::isObject(pVVar6);
        if (bVar1) goto LAB_00147ccd;
        bVar1 = false;
      }
    } while ((iVar9 < (int)AVar4) && (iVar9 = iVar9 + 1, !bVar1));
  }
  bVar3 = true;
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(long)(int)AVar4);
    bVar2 = this->field_0x68 | 1;
    this->field_0x68 = bVar2;
    iVar9 = AVar4 * 2 + 2;
    if ((int)AVar4 < 1) {
      bVar8 = 0;
    }
    else {
      lVar7 = 8;
      uVar10 = 0;
      bVar8 = 0;
      do {
        this_00 = (StyledStreamWriter *)value;
        pVVar6 = Value::operator[](value,(int)uVar10);
        bVar1 = hasCommentForValue(this_00,pVVar6);
        bVar8 = bVar8 | bVar1;
        pVVar6 = Value::operator[](value,(int)uVar10);
        writeValue(this,pVVar6);
        iVar9 = iVar9 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7);
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0x20;
      } while (AVar4 != uVar10);
      bVar2 = this->field_0x68;
    }
    this->field_0x68 = bVar2 & 0xfe;
    bVar3 = (bool)(this->rightMargin_ <= iVar9 | bVar8);
  }
  return bVar3;
}

Assistant:

bool StyledStreamWriter::isMultineArray(const Value& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}